

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_set_covered
               (MultiFab *mf,int icomp,int ncomp,int ngrow,
               Vector<double,_std::allocator<double>_> *a_vals)

{
  BATType BVar1;
  pointer __src;
  FabArray<amrex::FArrayBox> *this;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  size_t __n;
  long lVar8;
  ulong uVar9;
  size_type a_capacity;
  long lVar10;
  long lVar11;
  long lVar12;
  uint32_t *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  DeviceVector<Real> vals_dv;
  MFIter mfi;
  uint local_240;
  int local_22c;
  ulong local_208;
  ulong local_200;
  Box local_1d4;
  PODVector<double,_std::allocator<double>_> local_1b8;
  long local_198;
  ulong local_190;
  ulong local_188;
  long local_180;
  pointer local_178;
  long local_170;
  FabArray<amrex::FArrayBox> *local_168;
  FabArray<amrex::EBCellFlagFab> *local_160;
  long local_158;
  ulong local_150;
  long local_148;
  uint32_t *local_140;
  uint32_t *local_138;
  ulong local_130;
  long local_128;
  long local_120;
  EBCellFlag *local_118;
  Array4<double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  lVar2 = __dynamic_cast((mf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo);
  if (lVar2 != 0) {
    local_160 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar2 + 0xd8));
    BVar1 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
    uVar5 = 0;
    switch(BVar1) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      uVar5 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
              m_indexType.m_typ.itype;
      break;
    default:
      uVar5 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
              m_bndryReg.m_typ.itype;
    }
    if (uVar5 != 0) {
      uVar5 = 0;
      switch(BVar1) {
      case null:
      case coarsenRatio:
        break;
      case indexType:
      case indexType_coarsenRatio:
        uVar5 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                m_indexType.m_typ.itype;
        break;
      default:
        uVar5 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ.itype;
      }
      if (uVar5 != 7) {
        Assert_host("mf.ixType().cellCentered() || mf.ixType().nodeCentered()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                    ,0x4b,(char *)0x0);
      }
    }
    local_240 = 0;
    switch((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      local_240 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                  m_indexType.m_typ.itype;
      break;
    default:
      local_240 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ.itype;
    }
    iVar7 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    if (iVar7 < ngrow) {
      ngrow = iVar7;
    }
    uVar9 = (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_1b8.m_data = (pointer)0x0;
    local_1b8.m_size = 0;
    local_1b8.m_capacity = 0;
    a_capacity = 8;
    if (8 < uVar9) {
      do {
        a_capacity = a_capacity * 3 + 1 >> 1;
      } while (a_capacity < uVar9);
    }
    PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_1b8,a_capacity);
    __src = (a_vals->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
    __n = (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)__src;
    local_1b8.m_size = uVar9;
    if (__n != 0) {
      memcpy(local_1b8.m_data,__src,__n);
    }
    local_178 = local_1b8.m_data;
    MFIter::MFIter(&local_90,(FabArrayBase *)mf,true);
    if (local_90.currentIndex < local_90.endIndex) {
      local_188 = (ulong)(uint)ncomp;
      local_198 = (long)icomp << 3;
      local_168 = &mf->super_FabArray<amrex::FArrayBox>;
      do {
        this = local_168;
        MFIter::growntilebox(&local_1d4,&local_90,ngrow);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_d0,local_160,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this,&local_90);
        if (local_240 == 0) {
          if (0 < ncomp) {
            uVar9 = 0;
            lVar2 = local_198;
            do {
              uVar5 = local_1d4.smallend.vect[2];
              if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2]) {
                do {
                  if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1]) {
                    puVar13 = (uint32_t *)
                              ((long)&local_d0.p
                                      [(long)local_1d4.smallend.vect[0] +
                                       (((long)(int)uVar5 - (long)local_d0.begin.z) *
                                        local_d0.kstride - (long)local_d0.begin.x)].flag +
                              ((long)local_1d4.smallend.vect[1] - (long)local_d0.begin.y) *
                              local_d0.jstride * 4);
                    lVar15 = (long)local_1d4.smallend.vect[1];
                    do {
                      if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                        lVar3 = 0;
                        do {
                          if ((~puVar13[lVar3] & 3) == 0) {
                            *(double *)
                             ((long)local_110.p +
                             lVar3 * 8 +
                             local_110.nstride * lVar2 +
                             ((long)(int)uVar5 - (long)local_110.begin.z) * local_110.kstride * 8 +
                             (lVar15 - local_110.begin.y) * local_110.jstride * 8 +
                             (long)local_110.begin.x * -8 + (long)local_1d4.smallend.vect[0] * 8) =
                                 local_178[uVar9];
                          }
                          lVar3 = lVar3 + 1;
                        } while ((local_1d4.bigend.vect[0] - local_1d4.smallend.vect[0]) + 1 !=
                                 (int)lVar3);
                      }
                      lVar15 = lVar15 + 1;
                      puVar13 = puVar13 + local_d0.jstride;
                    } while (local_1d4.bigend.vect[1] + 1U != (int)lVar15);
                  }
                  bVar17 = uVar5 != local_1d4.bigend.vect[2];
                  uVar5 = uVar5 + 1;
                } while (bVar17);
              }
              uVar9 = uVar9 + 1;
              lVar2 = lVar2 + 8;
            } while (uVar9 != local_188);
          }
        }
        else if (0 < ncomp) {
          local_190 = (ulong)(uint)local_1d4.smallend.vect[2];
          local_150 = (ulong)(uint)local_1d4.bigend.vect[1];
          local_180 = (long)local_1d4.smallend.vect[1];
          lVar2 = (long)local_1d4.smallend.vect[0];
          local_158 = lVar2 * 4;
          local_148 = lVar2 * 8;
          local_170 = local_198;
          local_208 = 0;
          do {
            local_22c = local_1d4.smallend.vect[2] - 1;
            local_200 = local_190;
            if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2]) {
              do {
                if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1]) {
                  lVar3 = (long)local_d0.begin.x;
                  local_128 = (long)local_d0.begin.y;
                  local_130 = (ulong)(uint)~local_d0.begin.y;
                  lVar12 = (int)(~local_d0.begin.z + (uint)local_200) * local_d0.kstride;
                  lVar6 = (int)((uint)local_200 - local_d0.begin.z) * local_d0.kstride;
                  local_118 = local_d0.p;
                  lVar14 = ((long)(int)(uint)local_200 - (long)local_d0.begin.z) *
                           local_d0.kstride * 4;
                  local_138 = (uint32_t *)((long)&local_d0.p[lVar2 - lVar3].flag + lVar14);
                  local_120 = local_d0.jstride;
                  lVar15 = local_d0.jstride * 4;
                  lVar8 = (long)(local_22c - local_d0.begin.z) * local_d0.kstride * 4;
                  lVar11 = (local_180 - local_128) * lVar15;
                  iVar7 = (local_1d4.smallend.vect[1] + -1) - local_d0.begin.y;
                  local_140 = (uint32_t *)((long)&local_d0.p[lVar2 - lVar3].flag + lVar8);
                  lVar14 = (long)&local_d0.p[lVar2 - lVar3].flag + lVar14 + lVar11;
                  lVar8 = (long)&local_d0.p[lVar2 - lVar3].flag + lVar11 + lVar8;
                  lVar3 = local_180;
                  do {
                    if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                      lVar11 = (~local_d0.begin.y + (int)lVar3) * local_d0.jstride;
                      lVar10 = (lVar3 - local_128) * local_d0.jstride;
                      lVar4 = 0;
                      do {
                        lVar16 = (long)(((local_1d4.smallend.vect[0] + -1) - local_d0.begin.x) +
                                       (int)lVar4);
                        if ((((((~local_d0.p[lVar11 + lVar16 + lVar12].flag & 3) == 0) &&
                              ((~*(uint *)((long)local_140 + lVar4 * 4 + iVar7 * lVar15) & 3) == 0))
                             && ((~local_d0.p[lVar10 + lVar16 + lVar12].flag & 3) == 0)) &&
                            (((~*(uint *)(lVar8 + lVar4 * 4) & 3) == 0 &&
                             ((~local_d0.p[lVar11 + lVar16 + lVar6].flag & 3) == 0)))) &&
                           (((~*(uint *)((long)local_138 + lVar4 * 4 + iVar7 * lVar15) & 3) == 0 &&
                            (((~local_d0.p[lVar10 + lVar16 + lVar6].flag & 3) == 0 &&
                             ((~*(uint *)(lVar14 + lVar4 * 4) & 3) == 0)))))) {
                          *(double *)
                           ((long)local_110.p +
                           lVar4 * 8 +
                           local_110.nstride * local_170 +
                           ((long)(int)(uint)local_200 - (long)local_110.begin.z) *
                           local_110.kstride * 8 +
                           (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                           (long)local_110.begin.x * -8 + local_148) = local_178[local_208];
                        }
                        lVar4 = lVar4 + 1;
                      } while ((local_1d4.bigend.vect[0] - local_1d4.smallend.vect[0]) + 1 !=
                               (int)lVar4);
                    }
                    lVar3 = lVar3 + 1;
                    iVar7 = iVar7 + 1;
                    lVar14 = lVar14 + lVar15;
                    lVar8 = lVar8 + lVar15;
                  } while (local_1d4.bigend.vect[1] + 1U != (int)lVar3);
                }
                bVar17 = (uint)local_200 != local_1d4.bigend.vect[2];
                local_22c = local_22c + 1;
                local_200 = (ulong)((uint)local_200 + 1);
              } while (bVar17);
            }
            local_208 = local_208 + 1;
            local_170 = local_170 + 8;
          } while (local_208 != local_188);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
    if (local_1b8.m_data != (pointer)0x0) {
      operator_delete(local_1b8.m_data,local_1b8.m_capacity << 3);
    }
  }
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, const Vector<Real>& a_vals)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

    Gpu::DeviceVector<Real> vals_dv(a_vals.size());
    Gpu::copy(Gpu::hostToDevice, a_vals.begin(), a_vals.end(), vals_dv.begin());
    Real const* AMREX_RESTRICT vals = vals_dv.data();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = vals[n];
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,vals);
            });
        }
    }
}